

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fm_formats.c
# Opt level: O0

FMFieldList copy_field_list(FMFieldList list)

{
  int iVar1;
  FMFieldList p_Var2;
  char *pcVar3;
  FMFieldList in_RDI;
  int field;
  FMFieldList new_field_list;
  int field_count;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  int iVar4;
  
  iVar1 = count_FMfield(in_RDI);
  p_Var2 = (FMFieldList)ffs_malloc(CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
  for (iVar4 = 0; iVar4 < iVar1; iVar4 = iVar4 + 1) {
    pcVar3 = strdup(in_RDI[iVar4].field_name);
    p_Var2[iVar4].field_name = pcVar3;
    pcVar3 = strdup(in_RDI[iVar4].field_type);
    p_Var2[iVar4].field_type = pcVar3;
    p_Var2[iVar4].field_size = in_RDI[iVar4].field_size;
    p_Var2[iVar4].field_offset = in_RDI[iVar4].field_offset;
  }
  p_Var2[iVar1].field_name = (char *)0x0;
  p_Var2[iVar1].field_type = (char *)0x0;
  p_Var2[iVar1].field_offset = 0;
  p_Var2[iVar1].field_size = 0;
  return p_Var2;
}

Assistant:

extern
FMFieldList
copy_field_list(FMFieldList list)
{
    int field_count = count_FMfield(list);
    FMFieldList new_field_list;
    int field;

    new_field_list = (FMFieldList) malloc((size_t) sizeof(FMField) *
					     (field_count + 1));
    for (field = 0; field < field_count; field++) {
	new_field_list[field].field_name = strdup(list[field].field_name);
	new_field_list[field].field_type = strdup(list[field].field_type);
	new_field_list[field].field_size = list[field].field_size;
	new_field_list[field].field_offset = list[field].field_offset;
    }
    new_field_list[field_count].field_name = NULL;
    new_field_list[field_count].field_type = NULL;
    new_field_list[field_count].field_offset = 0;
    new_field_list[field_count].field_size = 0;
    return new_field_list;
}